

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

xml_node * xml_parse_node(xml_parser *parser)

{
  uint8_t uVar1;
  _Bool _Var2;
  xml_string *tag_open_00;
  xml_attribute **ppxVar3;
  size_t sVar4;
  xml_node *pxVar5;
  xml_node *local_70;
  xml_node **it;
  xml_node *node;
  size_t new_elements;
  size_t old_elements;
  xml_node *child;
  xml_node **children;
  xml_attribute **attributes;
  size_t original_length;
  xml_string *content;
  xml_string *tag_close;
  xml_string *tag_open;
  xml_parser *parser_local;
  
  content = (xml_string *)0x0;
  original_length = 0;
  child = (xml_node *)calloc(1,8);
  child->name = (xml_string *)0x0;
  tag_open_00 = xml_parse_tag_open(parser);
  if (tag_open_00 == (xml_string *)0x0) {
    xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag_open");
  }
  else {
    sVar4 = tag_open_00->length;
    ppxVar3 = xml_find_attributes(parser,tag_open_00);
    if ((tag_open_00->length != 0) && (tag_open_00->buffer[sVar4 - 1] == '/')) {
LAB_00101a69:
      pxVar5 = (xml_node *)malloc(0x20);
      pxVar5->name = tag_open_00;
      pxVar5->content = (xml_string *)original_length;
      pxVar5->attributes = ppxVar3;
      pxVar5->children = (xml_node **)child;
      return pxVar5;
    }
    uVar1 = xml_parser_peek(parser,0);
    if (uVar1 == '<') {
      while (uVar1 = xml_parser_peek(parser,1), uVar1 != '/') {
        pxVar5 = xml_parse_node(parser);
        if (pxVar5 == (xml_node *)0x0) {
          xml_parser_error(parser,NEXT_CHARACTER,"xml_parse_node::child");
          goto LAB_00101ab0;
        }
        sVar4 = get_zero_terminated_array_nodes((xml_node **)child);
        child = (xml_node *)realloc(child,(sVar4 + 2) * 8);
        (&child->name)[sVar4] = (xml_string *)pxVar5;
        (&child->content)[sVar4] = (xml_string *)0x0;
      }
    }
    else {
      original_length = (size_t)xml_parse_content(parser);
      if ((xml_string *)original_length == (xml_string *)0x0) {
        xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_node::content");
        goto LAB_00101ab0;
      }
    }
    content = xml_parse_tag_close(parser);
    if (content == (xml_string *)0x0) {
      xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag_close");
    }
    else {
      _Var2 = xml_string_equals(tag_open_00,content);
      if (_Var2) {
        xml_string_free(content);
        goto LAB_00101a69;
      }
      xml_parser_error(parser,NO_CHARACTER,"xml_parse_node::tag missmatch");
    }
  }
LAB_00101ab0:
  if (tag_open_00 != (xml_string *)0x0) {
    xml_string_free(tag_open_00);
  }
  if (content != (xml_string *)0x0) {
    xml_string_free(content);
  }
  if (original_length != 0) {
    xml_string_free((xml_string *)original_length);
  }
  for (local_70 = child; local_70->name != (xml_string *)0x0;
      local_70 = (xml_node *)&local_70->content) {
    xml_node_free((xml_node *)local_70->name);
  }
  free(child);
  return (xml_node *)0x0;
}

Assistant:

static struct xml_node* xml_parse_node(struct xml_parser* parser) {
	xml_parser_info(parser, "node");

	/* Setup variables
	 */
	struct xml_string* tag_open = 0;
	struct xml_string* tag_close = 0;
	struct xml_string* content = 0;

	size_t original_length;
	struct xml_attribute** attributes;

	struct xml_node** children = calloc(1, sizeof(struct xml_node*));
	children[0] = 0;


	/* Parse open tag
	 */
	tag_open = xml_parse_tag_open(parser);
	if (!tag_open) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag_open");
		goto exit_failure;
	}

	original_length = tag_open->length;
	attributes = xml_find_attributes(parser, tag_open);

	/* If tag ends with `/' it's self closing, skip content lookup */
	if (tag_open->length > 0 && '/' == tag_open->buffer[original_length - 1]) {
		/* Drop `/'
		 */
		goto node_creation;
	}

	/* If the content does not start with '<', a text content is assumed
	 */
	if ('<' != xml_parser_peek(parser, CURRENT_CHARACTER)) {
		content = xml_parse_content(parser);

		if (!content) {
			xml_parser_error(parser, 0, "xml_parse_node::content");
			goto exit_failure;
		}


	/* Otherwise children are to be expected
	 */
	} else while ('/' != xml_parser_peek(parser, NEXT_CHARACTER)) {

		/* Parse child node
		 */
		struct xml_node* child = xml_parse_node(parser);
		if (!child) {
			xml_parser_error(parser, NEXT_CHARACTER, "xml_parse_node::child");
			goto exit_failure;
		}

		/* Grow child array :)
		 */
		size_t old_elements = get_zero_terminated_array_nodes(children);
		size_t new_elements = old_elements + 1;
		children = realloc(children, (new_elements + 1) * sizeof(struct xml_node*));

		/* Save child
		 */
		children[new_elements - 1] = child;
		children[new_elements] = 0;
	}


	/* Parse close tag
	 */
	tag_close = xml_parse_tag_close(parser);
	if (!tag_close) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag_close");
		goto exit_failure;
	}


	/* Close tag has to match open tag
	 */
	if (!xml_string_equals(tag_open, tag_close)) {
		xml_parser_error(parser, NO_CHARACTER, "xml_parse_node::tag missmatch");
		goto exit_failure;
	}


	/* Return parsed node
	 */
	xml_string_free(tag_close);

node_creation:;
	struct xml_node* node = malloc(sizeof(struct xml_node));
	node->name = tag_open;
	node->content = content;
	node->attributes = attributes;
	node->children = children;
	return node;


	/* A failure occured, so free all allocalted resources
	 */
exit_failure:
	if (tag_open) {
		xml_string_free(tag_open);
	}
	if (tag_close) {
		xml_string_free(tag_close);
	}
	if (content) {
		xml_string_free(content);
	}

	struct xml_node** it = children;
	while (*it) {
		xml_node_free(*it);
		++it;
	}
	free(children);

	return 0;
}